

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

String * __thiscall
Jinx::Impl::Parser::ParseMultiName_abi_cxx11_
          (String *__return_storage_ptr__,Parser *this,
          initializer_list<Jinx::Impl::SymbolType> symbols)

{
  Symbol *pSVar1;
  SymbolType *pSVar2;
  SymbolType SVar3;
  pointer pSVar4;
  Symbol *pSVar5;
  long lVar6;
  
  if ((this->m_error == false) &&
     (pSVar4 = (this->m_currentSymbol)._M_current,
     pSVar4 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    if (pSVar4->type == NameValue) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__,&pSVar4->text);
      while( true ) {
        pSVar5 = (this->m_currentSymbol)._M_current;
        this->m_lastLine = pSVar5->lineNumber;
        pSVar1 = pSVar5 + 1;
        (this->m_currentSymbol)._M_current = pSVar1;
        if (this->m_error != false) {
          return __return_storage_ptr__;
        }
        if ((this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish == pSVar1) {
          return __return_storage_ptr__;
        }
        SVar3 = pSVar1->type;
        if (SVar3 == NewLine) {
          return __return_storage_ptr__;
        }
        if (pSVar5[1].text._M_string_length == 0) break;
        if (SVar3 != NameValue) {
          lVar6 = 0;
          while (symbols._M_len << 2 != lVar6) {
            pSVar2 = (SymbolType *)((long)symbols._M_array + lVar6);
            lVar6 = lVar6 + 4;
            if (SVar3 == *pSVar2) {
              return __return_storage_ptr__;
            }
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__," ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,&((this->m_currentSymbol)._M_current)->text);
      }
      return __return_storage_ptr__;
    }
    Error<>(this,"Unexpected symbol type when parsing name");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseMultiName(std::initializer_list<SymbolType> symbols)
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();

		while (IsSymbolValid(m_currentSymbol) && !m_currentSymbol->text.empty())
		{
			if (m_currentSymbol->type != SymbolType::NameValue)
			{
				for (auto symbol : symbols)
				{
					if (m_currentSymbol->type == symbol)
						return s;
				}
			}
			s += " ";
			s += m_currentSymbol->text;
			NextSymbol();
		}

		return s;
	}